

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O2

void test_unicode_escape_sequence_in_identifier(void)

{
  bool bVar1;
  version vVar2;
  wostream *pwVar3;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  initializer_list<mjs::token> __l;
  initializer_list<mjs::token> __l_00;
  initializer_list<mjs::token> __l_01;
  allocator_type local_192;
  allocator<wchar_t> local_191;
  vector<mjs::token,_std::allocator<mjs::token>_> _r;
  vector<mjs::token,_std::allocator<mjs::token>_> _l;
  undefined1 local_160 [40];
  wstring local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  local_160._0_8_ = 0xc;
  local_160._8_8_ = L"\\u0069\\u0066";
  check_lex_fails_abi_cxx11_(&local_38,(wstring_view *)local_160);
  std::__cxx11::string::~string((string *)&local_38);
  local_160._0_8_ = 0xc;
  local_160._8_8_ = L"\\u0069\\u0000";
  check_lex_fails_abi_cxx11_(&local_58,(wstring_view *)local_160);
  std::__cxx11::string::~string((string *)&local_58);
  local_160._0_8_ = 10;
  local_160._8_8_ = L"\\u0069\\u00";
  check_lex_fails_abi_cxx11_(&local_78,(wstring_view *)local_160);
  std::__cxx11::string::~string((string *)&local_78);
  local_160._0_8_ = 9;
  local_160._8_8_ = L"\\u0069\\u0";
  check_lex_fails_abi_cxx11_(&local_98,(wstring_view *)local_160);
  std::__cxx11::string::~string((string *)&local_98);
  local_160._0_8_ = 8;
  local_160._8_8_ = L"\\u0069\\u";
  check_lex_fails_abi_cxx11_(&local_b8,(wstring_view *)local_160);
  std::__cxx11::string::~string((string *)&local_b8);
  local_160._0_8_ = 7;
  local_160._8_8_ = L"\\u0069\\";
  check_lex_fails_abi_cxx11_(&local_d8,(wstring_view *)local_160);
  std::__cxx11::string::~string((string *)&local_d8);
  local_160._0_8_ = 10;
  local_160._8_8_ = L"\\u0069\\x66";
  check_lex_fails_abi_cxx11_(&local_f8,(wstring_view *)local_160);
  std::__cxx11::string::~string((string *)&local_f8);
  vVar2 = tested_version();
  if (vVar2 == es1) {
    local_160._0_8_ = 0xe;
    local_160._8_8_ = L"\\u0073X\\u0031d";
    check_lex_fails_abi_cxx11_(&local_118,(wstring_view *)local_160);
    std::__cxx11::string::~string((string *)&local_118);
    return;
  }
  local_160._0_8_ = 6;
  local_160._8_8_ = L"\\u0069";
  lex(&_l,(wstring_view *)local_160);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_138,L"i",&local_191);
  mjs::token::token((token *)local_160,identifier,&local_138);
  __l._M_len = 1;
  __l._M_array = (iterator)local_160;
  std::vector<mjs::token,_std::allocator<mjs::token>_>::vector(&_r,__l,&local_192);
  mjs::token::destroy((token *)local_160);
  std::__cxx11::wstring::~wstring((wstring *)&local_138);
  bVar1 = std::operator!=(&_l,&_r);
  if (bVar1) {
    pwVar3 = std::operator<<((wostream *)&std::wcerr,"test_unicode_escape_sequence_in_identifier");
    pwVar3 = std::operator<<(pwVar3," in ");
    pwVar3 = std::operator<<(pwVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                            );
    pwVar3 = std::operator<<(pwVar3,":");
    pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0xdc);
    pwVar3 = std::operator<<(pwVar3,":\n");
    pwVar3 = std::operator<<(pwVar3,"lex(LR\"(\\u0069)\")");
    pwVar3 = std::operator<<(pwVar3," != ");
    pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::identifier, L\"i\"})");
    pwVar3 = std::operator<<(pwVar3,"\n");
    pbVar4 = operator<<(pwVar3,&_l);
    pwVar3 = std::operator<<(pbVar4," != ");
    pbVar4 = operator<<(pwVar3,&_r);
    pwVar3 = std::operator<<(pbVar4,"\n");
    vVar2 = tested_version();
    pbVar4 = mjs::operator<<(pwVar3,vVar2);
    std::operator<<(pbVar4,"\n");
  }
  else {
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r);
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
    local_160._0_8_ = 0xe;
    local_160._8_8_ = L"\\u0073X\\u0031d";
    lex(&_l,(wstring_view *)local_160);
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_138,L"sX1d",&local_191);
    mjs::token::token((token *)local_160,identifier,&local_138);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_160;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector(&_r,__l_00,&local_192);
    mjs::token::destroy((token *)local_160);
    std::__cxx11::wstring::~wstring((wstring *)&local_138);
    bVar1 = std::operator!=(&_l,&_r);
    if (bVar1) {
      pwVar3 = std::operator<<((wostream *)&std::wcerr,"test_unicode_escape_sequence_in_identifier")
      ;
      pwVar3 = std::operator<<(pwVar3," in ");
      pwVar3 = std::operator<<(pwVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar3 = std::operator<<(pwVar3,":");
      pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0xdd);
      pwVar3 = std::operator<<(pwVar3,":\n");
      pwVar3 = std::operator<<(pwVar3,"lex(uid)");
      pwVar3 = std::operator<<(pwVar3," != ");
      pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::identifier, L\"sX1d\"})");
      pwVar3 = std::operator<<(pwVar3,"\n");
      pbVar4 = operator<<(pwVar3,&_l);
      pwVar3 = std::operator<<(pbVar4," != ");
      pbVar4 = operator<<(pwVar3,&_r);
      pwVar3 = std::operator<<(pbVar4,"\n");
      vVar2 = tested_version();
      pbVar4 = mjs::operator<<(pwVar3,vVar2);
      std::operator<<(pbVar4,"\n");
    }
    else {
      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r);
      std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
      local_160._0_8_ = 7;
      local_160._8_8_ = L"\\u1234申";
      lex(&_l,(wstring_view *)local_160);
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)&local_138,L"ሴ申",&local_191);
      mjs::token::token((token *)local_160,identifier,&local_138);
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_160;
      std::vector<mjs::token,_std::allocator<mjs::token>_>::vector(&_r,__l_01,&local_192);
      mjs::token::destroy((token *)local_160);
      std::__cxx11::wstring::~wstring((wstring *)&local_138);
      bVar1 = std::operator!=(&_l,&_r);
      if (!bVar1) {
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_r);
        std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector(&_l);
        return;
      }
      pwVar3 = std::operator<<((wostream *)&std::wcerr,"test_unicode_escape_sequence_in_identifier")
      ;
      pwVar3 = std::operator<<(pwVar3," in ");
      pwVar3 = std::operator<<(pwVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar3 = std::operator<<(pwVar3,":");
      pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,0xde);
      pwVar3 = std::operator<<(pwVar3,":\n");
      pwVar3 = std::operator<<(pwVar3,"lex(L\"\\\\u1234\\x7533\")");
      pwVar3 = std::operator<<(pwVar3," != ");
      pwVar3 = std::operator<<(pwVar3,"TOKENS(token{token_type::identifier, L\"\\x1234\\x7533\"})");
      pwVar3 = std::operator<<(pwVar3,"\n");
      pbVar4 = operator<<(pwVar3,&_l);
      pwVar3 = std::operator<<(pbVar4," != ");
      pbVar4 = operator<<(pwVar3,&_r);
      pwVar3 = std::operator<<(pbVar4,"\n");
      vVar2 = tested_version();
      pbVar4 = mjs::operator<<(pwVar3,vVar2);
      std::operator<<(pbVar4,"\n");
    }
  }
  abort();
}

Assistant:

void test_unicode_escape_sequence_in_identifier() {
    check_lex_fails(LR"(\u0069\u0066)"); // Must not spell 'if' like this
    check_lex_fails(LR"(\u0069\u0000)");
    check_lex_fails(LR"(\u0069\u00)");
    check_lex_fails(LR"(\u0069\u0)");
    check_lex_fails(LR"(\u0069\u)");
    check_lex_fails(LR"(\u0069\)");
    check_lex_fails(LR"(\u0069\x66)");

    const auto uid = LR"(\u0073X\u0031d)";
    if (tested_version() == version::es1) {
        check_lex_fails(uid);
    } else {
        SIMPLE_TEST(LR"(\u0069)", ID("i"));
        SIMPLE_TEST(uid, ID("sX1d"));
        SIMPLE_TEST(L"\\u1234\x7533", ID("\x1234\x7533"));
    }
}